

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O0

char cnpy::map_type(type_info *t)

{
  bool bVar1;
  type_info *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  char cVar2;
  
  bVar1 = std::type_info::operator==
                    (unaff_retaddr,
                     (type_info *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar1) {
    cVar2 = 'f';
  }
  else {
    bVar1 = std::type_info::operator==
                      (unaff_retaddr,
                       (type_info *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (bVar1) {
      cVar2 = 'f';
    }
    else {
      bVar1 = std::type_info::operator==
                        (unaff_retaddr,
                         (type_info *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8))
      ;
      if (bVar1) {
        cVar2 = 'f';
      }
      else {
        bVar1 = std::type_info::operator==
                          (unaff_retaddr,
                           (type_info *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        if (bVar1) {
          cVar2 = 'i';
        }
        else {
          bVar1 = std::type_info::operator==
                            (unaff_retaddr,
                             (type_info *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
          if (bVar1) {
            cVar2 = 'i';
          }
          else {
            bVar1 = std::type_info::operator==
                              (unaff_retaddr,
                               (type_info *)
                               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
            if (bVar1) {
              cVar2 = 'i';
            }
            else {
              bVar1 = std::type_info::operator==
                                (unaff_retaddr,
                                 (type_info *)
                                 CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
              if (bVar1) {
                cVar2 = 'i';
              }
              else {
                bVar1 = std::type_info::operator==
                                  (unaff_retaddr,
                                   (type_info *)
                                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
                if (bVar1) {
                  cVar2 = 'i';
                }
                else {
                  bVar1 = std::type_info::operator==
                                    (unaff_retaddr,
                                     (type_info *)
                                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
                  if (bVar1) {
                    cVar2 = 'u';
                  }
                  else {
                    bVar1 = std::type_info::operator==
                                      (unaff_retaddr,
                                       (type_info *)
                                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                                      );
                    if (bVar1) {
                      cVar2 = 'u';
                    }
                    else {
                      bVar1 = std::type_info::operator==
                                        (unaff_retaddr,
                                         (type_info *)
                                         CONCAT17(in_stack_ffffffffffffffff,
                                                  in_stack_fffffffffffffff8));
                      if (bVar1) {
                        cVar2 = 'u';
                      }
                      else {
                        bVar1 = std::type_info::operator==
                                          (unaff_retaddr,
                                           (type_info *)
                                           CONCAT17(in_stack_ffffffffffffffff,
                                                    in_stack_fffffffffffffff8));
                        if (bVar1) {
                          cVar2 = 'u';
                        }
                        else {
                          bVar1 = std::type_info::operator==
                                            (unaff_retaddr,
                                             (type_info *)
                                             CONCAT17(in_stack_ffffffffffffffff,
                                                      in_stack_fffffffffffffff8));
                          if (bVar1) {
                            cVar2 = 'u';
                          }
                          else {
                            bVar1 = std::type_info::operator==
                                              (unaff_retaddr,
                                               (type_info *)
                                               CONCAT17(in_stack_ffffffffffffffff,
                                                        in_stack_fffffffffffffff8));
                            if (bVar1) {
                              cVar2 = 'b';
                            }
                            else {
                              bVar1 = std::type_info::operator==
                                                (unaff_retaddr,
                                                 (type_info *)
                                                 CONCAT17(in_stack_ffffffffffffffff,
                                                          in_stack_fffffffffffffff8));
                              if (bVar1) {
                                cVar2 = 'c';
                              }
                              else {
                                bVar1 = std::type_info::operator==
                                                  (unaff_retaddr,
                                                   (type_info *)
                                                   CONCAT17(in_stack_ffffffffffffffff,
                                                            in_stack_fffffffffffffff8));
                                if (bVar1) {
                                  cVar2 = 'c';
                                }
                                else {
                                  bVar1 = std::type_info::operator==
                                                    (unaff_retaddr,
                                                     (type_info *)
                                                     CONCAT17(in_stack_ffffffffffffffff,
                                                              in_stack_fffffffffffffff8));
                                  if (bVar1) {
                                    cVar2 = 'c';
                                  }
                                  else {
                                    cVar2 = '?';
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return cVar2;
}

Assistant:

char cnpy::map_type(const std::type_info& t)
{
    if(t == typeid(float) ) return 'f';
    if(t == typeid(double) ) return 'f';
    if(t == typeid(long double) ) return 'f';

    if(t == typeid(int) ) return 'i';
    if(t == typeid(char) ) return 'i';
    if(t == typeid(short) ) return 'i';
    if(t == typeid(long) ) return 'i';
    if(t == typeid(long long) ) return 'i';

    if(t == typeid(unsigned char) ) return 'u';
    if(t == typeid(unsigned short) ) return 'u';
    if(t == typeid(unsigned long) ) return 'u';
    if(t == typeid(unsigned long long) ) return 'u';
    if(t == typeid(unsigned int) ) return 'u';

    if(t == typeid(bool) ) return 'b';

    if(t == typeid(std::complex<float>) ) return 'c';
    if(t == typeid(std::complex<double>) ) return 'c';
    if(t == typeid(std::complex<long double>) ) return 'c';

    else return '?';
}